

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-defend.c
# Opt level: O0

wchar_t borg_defend_aux_resist_fecap(wchar_t p1)

{
  _Bool _Var1;
  _Bool _Var2;
  _Bool _Var3;
  _Bool _Var4;
  _Bool _Var5;
  wchar_t wVar6;
  int iVar7;
  wchar_t local_24;
  wchar_t wStack_14;
  _Bool save_cold;
  _Bool save_elec;
  _Bool save_poison;
  _Bool save_acid;
  _Bool save_fire;
  wchar_t p2;
  wchar_t p1_local;
  
  if ((((((!borg.temp.res_fire) || (!borg.temp.res_acid)) || (!borg.temp.res_pois)) ||
       ((!borg.temp.res_elec || (!borg.temp.res_cold)))) &&
      ((borg.trait[0x70] == 0 && ((borg.trait[0x72] == 0 && (borg.trait[0x79] == 0)))))) &&
     ((_Var1 = borg_equips_item(act_resist_all,true), _Var1 ||
      (_Var1 = borg_equips_item(act_rage_bless_resist,true), _Var1)))) {
    wVar6 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
    _Var1 = (_Bool)(borg.temp.res_fire & 1);
    _Var2 = (_Bool)(borg.temp.res_elec & 1);
    _Var3 = (_Bool)(borg.temp.res_cold & 1);
    _Var4 = (_Bool)(borg.temp.res_acid & 1);
    _Var5 = (_Bool)(borg.temp.res_pois & 1);
    borg.temp.res_fire = true;
    borg.temp.res_elec = true;
    borg.temp.res_cold = true;
    borg.temp.res_acid = true;
    borg.temp.res_pois = true;
    wStack_14 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
    borg.temp.res_fire = _Var1;
    borg.temp.res_cold = _Var3;
    borg.temp.res_acid = _Var4;
    borg.temp.res_elec = _Var2;
    borg.temp.res_pois = _Var5;
    if ((borg_fighting_unique != L'\0') &&
       (iVar7 = strcmp(r_info[unique_on_level].name,"The Tarrasque"), iVar7 == 0)) {
      wStack_14 = (wStack_14 << 3) / 10;
    }
    if (0x2c < borg.trait[0x23]) {
      wStack_14 = (wStack_14 << 3) / 10;
    }
    if (wStack_14 < wVar6) {
      if (borg_fighting_unique == L'\0') {
        local_24 = (int)avoidance / 2;
      }
      else {
        local_24 = ((int)avoidance << 1) / 3;
      }
      if ((wStack_14 <= local_24) && ((int)avoidance / 7 < wVar6)) {
        if ((borg_simulate & 1U) != 0) {
          return (wVar6 - wStack_14) + L'\x02';
        }
        borg_note("# Attempting to cast FECAP");
        _Var1 = borg_activate_item(act_resist_all);
        if ((_Var1) || (_Var1 = borg_activate_item(act_rage_bless_resist), _Var1)) {
          borg.no_rest_prep = 21000;
        }
        return (wVar6 - wStack_14) + L'\x02';
      }
    }
  }
  return L'\0';
}

Assistant:

static int borg_defend_aux_resist_fecap(int p1)
{
    int  p2        = 0;
    bool save_fire = false, save_acid = false, save_poison = false,
         save_elec = false, save_cold = false;

    if (borg.temp.res_fire && borg.temp.res_acid && borg.temp.res_pois
        && borg.temp.res_elec && borg.temp.res_cold)
        return 0;

    /* Cant when screwed */
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISCONFUSED]
        || borg.trait[BI_ISFORGET])
        return 0;

    if (!borg_equips_item(act_resist_all, true)
        && !borg_equips_item(act_rage_bless_resist, true))
        return 0;

    /* elemental and PFE use the 'averaging' method for danger.  Redefine p1 as
     * such. */
    p1 = borg_danger(borg.c.y, borg.c.x, 1, false, false);

    /* pretend we are protected and look again */
    save_fire          = borg.temp.res_fire;
    save_elec          = borg.temp.res_elec;
    save_cold          = borg.temp.res_cold;
    save_acid          = borg.temp.res_acid;
    save_poison        = borg.temp.res_pois;
    borg.temp.res_fire = true;
    borg.temp.res_elec = true;
    borg.temp.res_cold = true;
    borg.temp.res_acid = true;
    borg.temp.res_pois = true;
    p2                 = borg_danger(borg.c.y, borg.c.x, 1, false, false);
    borg.temp.res_fire = save_fire;
    borg.temp.res_elec = save_elec;
    borg.temp.res_cold = save_cold;
    borg.temp.res_acid = save_acid;
    borg.temp.res_pois = save_poison;

    /* Hack -
     * If the borg is fighting a particular unique enhance the
     * benefit of the spell.
     */
    if (borg_fighting_unique
        && (streq(r_info[unique_on_level].name, "The Tarrasque")))
        p2 = p2 * 8 / 10;

    /* Hack -
     * If borg is high enough level, he does not need to worry
     * about mana consumption.  Cast the good spell.
     */
    if (borg.trait[BI_CLEVEL] >= 45)
        p2 = p2 * 8 / 10;

    /* if this is an improvement and we may not avoid monster now and */
    /* we may have before */
    if (p1 > p2
        && p2 <= (borg_fighting_unique ? ((avoidance * 2) / 3)
                                       : (avoidance / 2))
        && p1 > (avoidance / 7)) {

        /* Simulation */
        if (borg_simulate)
            return (p1 - p2 + 2);

        borg_note("# Attempting to cast FECAP");

        /* do it! */
        if (borg_activate_item(act_resist_all)
            || borg_activate_item(act_rage_bless_resist))

            /* No resting to recoup mana */
            borg.no_rest_prep = 21000;

        /* Value */
        return (p1 - p2 + 2);
    }

    /* default to can't do it. */
    return 0;
}